

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b-plus-tree.cpp
# Opt level: O2

int __thiscall BPTree::display(BPTree *this,Node *cursor,int nodecount,bool first)

{
  int iVar1;
  ostream *poVar2;
  undefined7 in_register_00000009;
  int i;
  long lVar3;
  ulong uVar4;
  int j;
  long lVar5;
  
  if ((int)CONCAT71(in_register_00000009,first) == 0) {
    if (cursor->IS_LEAF == false) {
      for (lVar3 = 0; lVar3 <= cursor->size; lVar3 = lVar3 + 1) {
        iVar1 = display(this,cursor->ptr[lVar3],0,false);
        nodecount = nodecount + iVar1;
      }
      iVar1 = nodecount + 1;
    }
    else {
      lVar5 = 0;
      iVar1 = 1;
      for (lVar3 = 0; lVar3 < cursor->size; lVar3 = lVar3 + 1) {
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,*(float *)((long)&cursor->key->key_value + lVar5))
        ;
        std::operator<<(poVar2," ");
        lVar5 = lVar5 + 0x20;
      }
    }
  }
  else {
    for (uVar4 = 0; (long)uVar4 <= (long)cursor->size; uVar4 = uVar4 + 1) {
      if (uVar4 != (uint)cursor->size) {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,cursor->key[uVar4].key_value);
        std::operator<<(poVar2,"\n");
      }
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
      std::operator<<(poVar2,"\n");
      lVar3 = 0;
      for (lVar5 = 0; lVar5 < cursor->ptr[uVar4]->size; lVar5 = lVar5 + 1) {
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            *(float *)((long)&cursor->ptr[uVar4]->key->key_value + lVar3));
        std::operator<<(poVar2," ");
        lVar3 = lVar3 + 0x20;
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int display(Node* cursor, int nodecount, bool first) {
        if (first == true) {
            for (int i = 0;i<cursor->size+1 ; i++){
                if (i!=cursor->size) {
                    cout << 0 << " " << cursor->key[i].key_value << "\n";
                }
                cout << 1 << "\n";
                //cout << cursor->ptr[i]->size << " Size \n";
                for (int j = 0; j<cursor->ptr[i]->size; j++){
                    cout << cursor->ptr[i]->key[j].key_value << " ";
                }
                cout << "\n";
            }
            return 0;
        }
        else {
        int thisnode;
        if (cursor->IS_LEAF == false) {
            for (int i = 0; i < cursor->size + 1; i++) {
                thisnode = display(cursor->ptr[i], 0, false);
                nodecount = nodecount + thisnode;
                //cout<<"\n"<<nodecount<<"\n";

                //read(curr->child_ptr[i]);

            }
            nodecount++;
            return nodecount;
        }
        if (cursor->IS_LEAF == true) {

            for (int i = 0; i < cursor->size; i++) {
                cout << cursor->key[i].key_value << " ";
            }
            return 1;
        }
        return 0;
    }
    }